

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::NetworkUpdateParameters::_InternalSerialize
          (NetworkUpdateParameters *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint uVar2;
  Optimizer *this_00;
  Int64Parameter *pIVar3;
  BoolParameter *this_01;
  ulong uVar4;
  void *data;
  Type *this_02;
  int index;
  uint8_t *puVar5;
  undefined8 *puVar6;
  size_t __n;
  
  iVar1 = (this->losslayers_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (&(this->losslayers_).super_RepeatedPtrFieldBase,index);
      *target = '\n';
      uVar2 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (uint8_t)uVar2;
      if (uVar2 < 0x80) {
        puVar5 = target + 2;
      }
      else {
        puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar2,target + 1);
      }
      target = LossLayer::_InternalSerialize(this_02,puVar5,stream);
      index = index + 1;
    } while (iVar1 != index);
  }
  if ((this != (NetworkUpdateParameters *)_NetworkUpdateParameters_default_instance_) &&
     (this->optimizer_ != (Optimizer *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->optimizer_;
    *target = '\x12';
    uVar2 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar2;
    if (uVar2 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar2,target + 1);
    }
    target = Optimizer::_InternalSerialize(this_00,puVar5,stream);
  }
  if ((this != (NetworkUpdateParameters *)_NetworkUpdateParameters_default_instance_) &&
     (this->epochs_ != (Int64Parameter *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pIVar3 = this->epochs_;
    *target = '\x1a';
    uVar2 = (pIVar3->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar2;
    if (uVar2 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar2,target + 1);
    }
    target = Int64Parameter::_InternalSerialize(pIVar3,puVar5,stream);
  }
  if ((this != (NetworkUpdateParameters *)_NetworkUpdateParameters_default_instance_) &&
     (this->shuffle_ != (BoolParameter *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = this->shuffle_;
    *target = 'R';
    uVar2 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar2;
    if (uVar2 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar2,target + 1);
    }
    target = BoolParameter::_InternalSerialize(this_01,puVar5,stream);
  }
  if ((this != (NetworkUpdateParameters *)_NetworkUpdateParameters_default_instance_) &&
     (this->seed_ != (Int64Parameter *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pIVar3 = this->seed_;
    target[0] = 0xa2;
    target[1] = '\x01';
    uVar2 = (pIVar3->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[2] = (uint8_t)uVar2;
    if (uVar2 < 0x80) {
      puVar5 = target + 3;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar2,target + 2);
    }
    target = Int64Parameter::_InternalSerialize(pIVar3,puVar5,stream);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    data = *(void **)((uVar4 & 0xfffffffffffffffc) + 8);
    uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar4 & 1) == 0) {
      puVar6 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar6 = (undefined8 *)((uVar4 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar6[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar6[1],target);
      return puVar5;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* NetworkUpdateParameters::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.NetworkUpdateParameters)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.LossLayer lossLayers = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_losslayers_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_losslayers(i), target, stream);
  }

  // .CoreML.Specification.Optimizer optimizer = 2;
  if (this->_internal_has_optimizer()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::optimizer(this), target, stream);
  }

  // .CoreML.Specification.Int64Parameter epochs = 3;
  if (this->_internal_has_epochs()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::epochs(this), target, stream);
  }

  // .CoreML.Specification.BoolParameter shuffle = 10;
  if (this->_internal_has_shuffle()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        10, _Internal::shuffle(this), target, stream);
  }

  // .CoreML.Specification.Int64Parameter seed = 20;
  if (this->_internal_has_seed()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        20, _Internal::seed(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.NetworkUpdateParameters)
  return target;
}